

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlCtxtParseEntity(xmlParserCtxtPtr ctxt,xmlEntityPtr ent)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint hasTextDecl;
  uint buildTree_00;
  int oldNodemem;
  int oldNodelen;
  int oldMinNsIndex;
  int buildTree;
  int isExternal;
  unsigned_long consumed;
  xmlNodePtr list;
  xmlParserInputPtr input;
  xmlEntityPtr ent_local;
  xmlParserCtxtPtr ctxt_local;
  
  hasTextDecl = (uint)(ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY);
  buildTree_00 = (uint)(ctxt->node != (xmlNodePtr)0x0);
  input = (xmlParserInputPtr)ent;
  ent_local = (xmlEntityPtr)ctxt;
  if ((ent->flags & 8U) == 0) {
    list = (xmlNodePtr)xmlNewEntityInputStream(ctxt,ent);
    if ((xmlParserInputPtr)list != (xmlParserInputPtr)0x0) {
      uVar1 = *(undefined4 *)&(ent_local[5].next)->last;
      if (buildTree_00 != 0) {
        *(undefined4 *)&(ent_local[5].next)->last = *(undefined4 *)((long)&ent_local[3].orig + 4);
      }
      uVar2 = *(undefined4 *)((long)&ent_local[2].URI + 4);
      iVar3 = ent_local[2].owner;
      *(undefined4 *)((long)&ent_local[2].URI + 4) = 0;
      ent_local[2].owner = 0;
      *(uint *)((long)&input[1].filename + 4) = *(uint *)((long)&input[1].filename + 4) | 8;
      consumed = (unsigned_long)
                 xmlCtxtParseContentInternal
                           ((xmlParserCtxtPtr)ent_local,(xmlParserInputPtr)list,hasTextDecl,
                            buildTree_00);
      *(uint *)((long)&input[1].filename + 4) = *(uint *)((long)&input[1].filename + 4) & 0xfffffff7
      ;
      *(undefined4 *)&(ent_local[5].next)->last = uVar1;
      *(undefined4 *)((long)&ent_local[2].URI + 4) = uVar2;
      ent_local[2].owner = iVar3;
      _buildTree = list->doc;
      xmlSaturatedAddSizeT((unsigned_long *)&buildTree,(long)list->parent - (long)list->children);
      if (((ulong)input[1].filename & 0x200000000) == 0) {
        xmlSaturatedAdd((unsigned_long *)&input[1].directory,(unsigned_long)_buildTree);
      }
      if (((ulong)input[1].filename & 0x100000000) == 0) {
        if (hasTextDecl != 0) {
          xmlSaturatedAdd((unsigned_long *)&ent_local[4].owner,(unsigned_long)_buildTree);
        }
        input->base = (xmlChar *)consumed;
        for (; consumed != 0; consumed = *(unsigned_long *)(consumed + 0x30)) {
          *(xmlParserInputPtr *)(consumed + 0x28) = input;
          if (*(unsigned_long *)(consumed + 0x40) != input->consumed) {
            xmlSetTreeDoc((xmlNodePtr)consumed,(xmlDocPtr)input->consumed);
          }
          if (*(long *)(consumed + 0x30) == 0) {
            input->cur = (xmlChar *)consumed;
          }
        }
      }
      else {
        xmlFreeNodeList((xmlNodePtr)consumed);
      }
      xmlFreeInputStream((xmlParserInputPtr)list);
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
    xmlHaltParser((xmlParserCtxtPtr)ent_local);
  }
  *(uint *)((long)&input[1].filename + 4) = *(uint *)((long)&input[1].filename + 4) | 3;
  return;
}

Assistant:

static void
xmlCtxtParseEntity(xmlParserCtxtPtr ctxt, xmlEntityPtr ent) {
    xmlParserInputPtr input;
    xmlNodePtr list;
    unsigned long consumed;
    int isExternal;
    int buildTree;
    int oldMinNsIndex;
    int oldNodelen, oldNodemem;

    isExternal = (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY);
    buildTree = (ctxt->node != NULL);

    /*
     * Recursion check
     */
    if (ent->flags & XML_ENT_EXPANDING) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
        xmlHaltParser(ctxt);
        goto error;
    }

    /*
     * Load entity
     */
    input = xmlNewEntityInputStream(ctxt, ent);
    if (input == NULL)
        goto error;

    /*
     * When building a tree, we need to limit the scope of namespace
     * declarations, so that entities don't reference xmlNs structs
     * from the parent of a reference.
     */
    oldMinNsIndex = ctxt->nsdb->minNsIndex;
    if (buildTree)
        ctxt->nsdb->minNsIndex = ctxt->nsNr;

    oldNodelen = ctxt->nodelen;
    oldNodemem = ctxt->nodemem;
    ctxt->nodelen = 0;
    ctxt->nodemem = 0;

    /*
     * Parse content
     *
     * This initiates a recursive call chain:
     *
     * - xmlCtxtParseContentInternal
     * - xmlParseContentInternal
     * - xmlParseReference
     * - xmlCtxtParseEntity
     *
     * The nesting depth is limited by the maximum number of inputs,
     * see xmlCtxtPushInput.
     *
     * It's possible to make this non-recursive (minNsIndex must be
     * stored in the input struct) at the expense of code readability.
     */

    ent->flags |= XML_ENT_EXPANDING;

    list = xmlCtxtParseContentInternal(ctxt, input, isExternal, buildTree);

    ent->flags &= ~XML_ENT_EXPANDING;

    ctxt->nsdb->minNsIndex = oldMinNsIndex;
    ctxt->nodelen = oldNodelen;
    ctxt->nodemem = oldNodemem;

    /*
     * Entity size accounting
     */
    consumed = input->consumed;
    xmlSaturatedAddSizeT(&consumed, input->end - input->base);

    if ((ent->flags & XML_ENT_CHECKED) == 0)
        xmlSaturatedAdd(&ent->expandedSize, consumed);

    if ((ent->flags & XML_ENT_PARSED) == 0) {
        if (isExternal)
            xmlSaturatedAdd(&ctxt->sizeentities, consumed);

        ent->children = list;

        while (list != NULL) {
            list->parent = (xmlNodePtr) ent;

            /*
             * Downstream code like the nginx xslt module can set
             * ctxt->myDoc->extSubset to a separate DTD, so the entity
             * might have a different or a NULL document.
             */
            if (list->doc != ent->doc)
                xmlSetTreeDoc(list, ent->doc);

            if (list->next == NULL)
                ent->last = list;
            list = list->next;
        }
    } else {
        xmlFreeNodeList(list);
    }

    xmlFreeInputStream(input);

error:
    ent->flags |= XML_ENT_PARSED | XML_ENT_CHECKED;
}